

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateStructConstructors
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
          *structData)

{
  pointer pcVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pMVar6;
  long lVar7;
  pointer pMVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string *str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  initializers;
  string argument;
  allocator_type local_2d2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
  *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string *local_268;
  VulkanHppGenerator *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string local_218;
  string local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  long *local_1c0;
  size_type local_1b8;
  long local_1b0 [2];
  string local_1a0;
  string local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_2b0 = structData;
  local_268 = __return_storage_ptr__;
  local_260 = this;
  if ((generateStructConstructors(std::pair<std::__cxx11::string,VulkanHppGenerator::StructureData>const&)
       ::constructors_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&generateStructConstructors(std::pair<std::__cxx11::string,VulkanHppGenerator::StructureData>const&)
                                   ::constructors_abi_cxx11_), iVar2 != 0)) {
    generateStructConstructors(std::pair<std::__cxx11::string,VulkanHppGenerator::StructureData>const&)
    ::constructors_abi_cxx11_._M_dataplus._M_p =
         (pointer)&generateStructConstructors(std::pair<std::__cxx11::string,VulkanHppGenerator::StructureData>const&)
                   ::constructors_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &generateStructConstructors(std::pair<std::__cxx11::string,VulkanHppGenerator::StructureData>const&)
                ::constructors_abi_cxx11_,
               "${constexpr}${structName}(${arguments}) VULKAN_HPP_NOEXCEPT\n    ${initializers}\n    {}\n\n    ${constexpr}${structName}( ${structName} const & rhs ) VULKAN_HPP_NOEXCEPT = default;\n\n    ${structName}( Vk${structName} const & rhs ) VULKAN_HPP_NOEXCEPT\n      : ${structName}( *reinterpret_cast<${structName} const *>( &rhs ) )\n    {}\n"
               ,"");
    __cxa_atexit(std::__cxx11::string::~string,
                 &generateStructConstructors(std::pair<std::__cxx11::string,VulkanHppGenerator::StructureData>const&)
                  ::constructors_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&generateStructConstructors(std::pair<std::__cxx11::string,VulkanHppGenerator::StructureData>const&)
                         ::constructors_abi_cxx11_);
    structData = local_2b0;
  }
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar6 = (structData->second).members.
           super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar8 = (structData->second).members.
           super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar6 != pMVar8) {
    paVar9 = &local_160.first.field_2;
    do {
      generateStructConstructorArgument_abi_cxx11_(&local_160.first,local_260,pMVar6,true);
      if (local_160.first._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_238,&local_160.first);
      }
      if ((pMVar6->value)._M_string_length == 0) {
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        pcVar1 = (pMVar6->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,pcVar1,pcVar1 + (pMVar6->name)._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_2d0,"{ ");
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_2d0,(pMVar6->name)._M_dataplus._M_p,
                           (pMVar6->name)._M_string_length);
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar3->_M_dataplus)._M_p;
        paVar4 = &pbVar3->field_2;
        if (paVar5 == paVar4) {
          local_2a8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        }
        else {
          local_2a8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_2a8._M_dataplus._M_p = (pointer)paVar5;
        }
        local_2a8._M_string_length = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_2a8,"_ }");
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar3->_M_dataplus)._M_p;
        paVar4 = &pbVar3->field_2;
        if (paVar5 == paVar4) {
          local_288.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        }
        else {
          local_288.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_288._M_dataplus._M_p = (pointer)paVar5;
        }
        local_288._M_string_length = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8,
                   &local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.first._M_dataplus._M_p != paVar9) {
        operator_delete(local_160.first._M_dataplus._M_p,
                        local_160.first.field_2._M_allocated_capacity + 1);
      }
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != pMVar8);
    pMVar6 = (local_2b0->second).members.
             super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar8 = (local_2b0->second).members.
             super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar6 != pMVar8) {
      do {
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&pMVar6->name,"pNext");
        if (iVar2 == 0) break;
        pMVar6 = pMVar6 + 1;
      } while (pMVar6 != pMVar8);
      pMVar8 = (local_2b0->second).members.
               super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pMVar6 != pMVar8) {
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"VULKAN_HPP_NAMESPACE","");
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Vk","");
      TypeInfo::compose(&local_288,&pMVar6->type,&local_2a8,&local_2d0);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_288," pNext_ = nullptr");
      local_160.first._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.first._M_dataplus._M_p == paVar5) {
        local_160.first.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_160.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_160.first._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        local_160.first.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_160.first._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
                 &local_160.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.first._M_dataplus._M_p != paVar9) {
        operator_delete(local_160.first._M_dataplus._M_p,
                        local_160.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,", ","");
  anon_unknown.dwarf_18c225::generateList(&local_288,&local_238,&local_2a8,&local_2d0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_160,(char (*) [10])"arguments",&local_288);
  generateConstexprString(&local_180,local_260,&local_2b0->first);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_120,(char (*) [10])"constexpr",&local_180);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,": ","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,", ","");
  anon_unknown.dwarf_18c225::generateList(&local_1a0,&local_1d8,&local_1f8,&local_218);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_e0,(char (*) [13])"initializers",&local_1a0);
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"Vk","");
  pcVar1 = (local_2b0->first)._M_dataplus._M_p;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar1,pcVar1 + (local_2b0->first)._M_string_length);
  if ((local_1b8 <= local_258._M_string_length) &&
     ((local_1b8 == 0 || (iVar2 = bcmp(local_258._M_dataplus._M_p,local_1c0,local_1b8), iVar2 == 0))
     )) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_258,0,local_1b8);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_a0,(char (*) [11])"structName",&local_258);
  __l._M_len = 4;
  __l._M_array = &local_160;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,&local_2d1,&local_2d2);
  replaceWithMap(local_268,
                 &generateStructConstructors(std::pair<std::__cxx11::string,VulkanHppGenerator::StructureData>const&)
                  ::constructors_abi_cxx11_,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  lVar7 = -0x100;
  paVar9 = &local_a0.second.field_2;
  do {
    if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar9->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar9->_M_allocated_capacity)[-2],paVar9->_M_allocated_capacity + 1
                     );
    }
    if (&paVar9->_M_allocated_capacity + -4 != (size_type *)(&paVar9->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar9->_M_allocated_capacity)[-6],
                      (&paVar9->_M_allocated_capacity)[-4] + 1);
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar9->_M_allocated_capacity + -8);
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((local_2b0->second).returnedOnly == false) {
    generateStructConstructorsEnhanced(&local_160.first,local_260,local_2b0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (local_268,local_160.first._M_dataplus._M_p,local_160.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
      operator_delete(local_160.first._M_dataplus._M_p,
                      local_160.first.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  return local_268;
}

Assistant:

std::string VulkanHppGenerator::generateStructConstructors( std::pair<std::string, StructureData> const & structData ) const
{
  // the constructor with all the elements as arguments, with defaults
  // and the simple copy constructor from the corresponding vulkan structure
  static const std::string constructors = R"(${constexpr}${structName}(${arguments}) VULKAN_HPP_NOEXCEPT
    ${initializers}
    {}

    ${constexpr}${structName}( ${structName} const & rhs ) VULKAN_HPP_NOEXCEPT = default;

    ${structName}( Vk${structName} const & rhs ) VULKAN_HPP_NOEXCEPT
      : ${structName}( *reinterpret_cast<${structName} const *>( &rhs ) )
    {}
)";

  std::vector<std::string> arguments, initializers;
  for ( auto const & member : structData.second.members )
  {
    // gather the arguments
    std::string argument = generateStructConstructorArgument( member, true );
    if ( !argument.empty() )
    {
      arguments.push_back( argument );
    }

    // gather the initializers; skip members with exactly one legal value
    if ( member.value.empty() )
    {
      initializers.push_back( member.name + "{ " + member.name + "_ }" );
    }
  }
  auto pNextIt = std::ranges::find_if( structData.second.members, []( MemberData const & md ) { return md.name == "pNext"; } );
  if ( pNextIt != structData.second.members.end() )
  {
    // add pNext as a last optional argument to the constructor
    arguments.push_back( pNextIt->type.compose( "VULKAN_HPP_NAMESPACE" ) + " pNext_ = nullptr" );
  }

  std::string str = replaceWithMap( constructors,
                                    { { "arguments", generateList( arguments, "", ", " ) },
                                      { "constexpr", generateConstexprString( structData.first ) },
                                      { "initializers", generateList( initializers, ": ", ", " ) },
                                      { "structName", stripPrefix( structData.first, "Vk" ) } } );

  if ( !structData.second.returnedOnly )
  {
    str += generateStructConstructorsEnhanced( structData );
  }
  return str;
}